

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configmng.cpp
# Opt level: O1

void __thiscall banksia::Config::updateOption(Config *this,Option *o)

{
  pointer pOVar1;
  size_t __n;
  bool bVar2;
  int iVar3;
  Option *option;
  pointer this_00;
  bool bVar4;
  bool bVar5;
  
  this_00 = (this->optionList).super__Vector_base<banksia::Option,_std::allocator<banksia::Option>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (this->optionList).super__Vector_base<banksia::Option,_std::allocator<banksia::Option>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar4 = this_00 == pOVar1;
    if (bVar4) {
LAB_0014e58d:
      appendOption(this,o);
      return;
    }
    __n = (this_00->name)._M_string_length;
    if (__n == (o->name)._M_string_length) {
      if (__n == 0) {
        bVar5 = true;
      }
      else {
        iVar3 = bcmp((this_00->name)._M_dataplus._M_p,(o->name)._M_dataplus._M_p,__n);
        bVar5 = iVar3 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      bVar2 = Option::operator==(this_00,o);
      if (!bVar2) {
        Option::update(this_00,o);
      }
      if (bVar5) {
        if (!bVar4) {
          return;
        }
        goto LAB_0014e58d;
      }
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

void Config::updateOption(const Option& o)
{
    for(auto && option : optionList) {
        if (option.name == o.name) {
            if (option != o) {
                option.update(o);
            }
            return;
        }
    }
    appendOption(o);
}